

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::setRowHidden(QListView *this,int row,bool hide)

{
  bool bVar1;
  QListViewPrivate *pQVar2;
  undefined1 in_DL;
  uint in_ESI;
  int unaff_retaddr;
  QListViewPrivate *in_stack_00000008;
  bool hidden;
  QListViewPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  int delay;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar3;
  
  uVar3 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  pQVar2 = d_func((QListView *)0x876f33);
  bVar1 = QListViewPrivate::isHidden(in_stack_00000008,unaff_retaddr);
  if (((uVar3 & 0x1000000) == 0) || (bVar1)) {
    if (((uVar3 & 0x1000000) == 0) && (bVar1)) {
      (*pQVar2->commonListView->_vptr_QCommonListViewBase[0x12])
                (pQVar2->commonListView,(ulong)in_ESI);
    }
    delay = (int)((ulong)pQVar2 >> 0x20);
  }
  else {
    (*pQVar2->commonListView->_vptr_QCommonListViewBase[0x11])(pQVar2->commonListView,(ulong)in_ESI)
    ;
    delay = (int)((ulong)pQVar2 >> 0x20);
  }
  QAbstractItemViewPrivate::doDelayedItemsLayout
            ((QAbstractItemViewPrivate *)CONCAT44(in_ESI,uVar3),delay);
  QWidget::update(in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void QListView::setRowHidden(int row, bool hide)
{
    Q_D(QListView);
    const bool hidden = d->isHidden(row);
    if (hide && !hidden)
        d->commonListView->appendHiddenRow(row);
    else if (!hide && hidden)
        d->commonListView->removeHiddenRow(row);
    d->doDelayedItemsLayout();
    d->viewport->update();
}